

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

TPZAutoPointer<TPZMatrix<std::complex<float>_>_> * __thiscall
TPZAutoPointer<TPZMatrix<std::complex<float>_>_>::operator=
          (TPZAutoPointer<TPZMatrix<std::complex<float>_>_> *this,
          TPZMatrix<std::complex<float>_> *rval)

{
  bool bVar1;
  TPZReference *this_00;
  
  if (this->fRef != (TPZReference *)0x0) {
    bVar1 = TPZReference::Decrease(this->fRef);
    if (bVar1) {
      Release(this);
    }
  }
  this_00 = (TPZReference *)operator_new(0x10);
  TPZReference::TPZReference(this_00,rval);
  this->fRef = this_00;
  return this;
}

Assistant:

TPZAutoPointer &operator=(T *rval)
    {
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(rval);
        return *this;
    }